

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5ConfigParseRank(char *zIn,char **pzRank,char **pzRankArgs)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  int *pRc;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *pArgs;
  char *zRankArgs;
  char *zRank;
  char *pRank;
  char *p;
  int rc;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffb0;
  void *local_48;
  void *local_40;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  local_c = 0;
  *in_RSI = 0;
  *in_RDX = 0;
  if (in_RDI == 0) {
    local_c = 1;
  }
  else {
    pcVar2 = fts5ConfigSkipWhitespace((char *)in_stack_ffffffffffffffb0);
    pcVar3 = fts5ConfigSkipBareword((char *)in_stack_ffffffffffffffb0);
    if (pcVar3 == (char *)0x0) {
      local_c = 1;
    }
    else {
      local_40 = sqlite3Fts5MallocZero
                           (in_stack_ffffffffffffffb0,
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (local_40 != (void *)0x0) {
        memcpy(local_40,pcVar2,(long)pcVar3 - (long)pcVar2);
      }
    }
    if ((local_c == 0) &&
       (pcVar2 = fts5ConfigSkipWhitespace((char *)in_stack_ffffffffffffffb0), *pcVar2 != '(')) {
      local_c = 1;
    }
    if ((local_c == 0) &&
       (pRc = (int *)fts5ConfigSkipWhitespace(&DAT_aaaaaaaaaaaaaaaa), (char)*pRc != ')')) {
      pcVar2 = fts5ConfigSkipArgs((char *)pRc);
      if (pcVar2 == (char *)0x0) {
        local_c = 1;
      }
      else {
        local_48 = sqlite3Fts5MallocZero
                             (pRc,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (local_48 != (void *)0x0) {
          memcpy(local_48,pRc,(long)pcVar2 - (long)pRc);
        }
      }
    }
  }
  if (local_c == 0) {
    *in_RSI = local_40;
    *in_RDX = local_48;
  }
  else {
    sqlite3_free((void *)0x26ac36);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

static int sqlite3Fts5ConfigParseRank(
  const char *zIn,                /* Input string */
  char **pzRank,                  /* OUT: Rank function name */
  char **pzRankArgs               /* OUT: Rank function arguments */
){
  const char *p = zIn;
  const char *pRank;
  char *zRank = 0;
  char *zRankArgs = 0;
  int rc = SQLITE_OK;

  *pzRank = 0;
  *pzRankArgs = 0;

  if( p==0 ){
    rc = SQLITE_ERROR;
  }else{
    p = fts5ConfigSkipWhitespace(p);
    pRank = p;
    p = fts5ConfigSkipBareword(p);

    if( p ){
      zRank = sqlite3Fts5MallocZero(&rc, 1 + p - pRank);
      if( zRank ) memcpy(zRank, pRank, p-pRank);
    }else{
      rc = SQLITE_ERROR;
    }

    if( rc==SQLITE_OK ){
      p = fts5ConfigSkipWhitespace(p);
      if( *p!='(' ) rc = SQLITE_ERROR;
      p++;
    }
    if( rc==SQLITE_OK ){
      const char *pArgs;
      p = fts5ConfigSkipWhitespace(p);
      pArgs = p;
      if( *p!=')' ){
        p = fts5ConfigSkipArgs(p);
        if( p==0 ){
          rc = SQLITE_ERROR;
        }else{
          zRankArgs = sqlite3Fts5MallocZero(&rc, 1 + p - pArgs);
          if( zRankArgs ) memcpy(zRankArgs, pArgs, p-pArgs);
        }
      }
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(zRank);
    assert( zRankArgs==0 );
  }else{
    *pzRank = zRank;
    *pzRankArgs = zRankArgs;
  }
  return rc;
}